

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# X86IntelInstPrinter.c
# Opt level: O0

void printU8Imm(MCInst *MI,uint Op,SStream *O)

{
  cs_detail *pcVar1;
  MCOperand *op;
  int64_t iVar2;
  uint8_t *puVar3;
  SStream *in_RDX;
  uint in_ESI;
  MCInst *in_RDI;
  cs_struct *unaff_retaddr;
  uint8_t access [6];
  uint8_t val;
  undefined8 in_stack_ffffffffffffffd8;
  undefined1 positive;
  undefined7 in_stack_ffffffffffffffe0;
  byte bVar4;
  undefined4 in_stack_fffffffffffffff0;
  
  positive = (undefined1)((ulong)in_stack_ffffffffffffffd8 >> 0x38);
  op = MCInst_getOperand(in_RDI,in_ESI);
  iVar2 = MCOperand_getImm(op);
  bVar4 = (byte)iVar2;
  printImm((MCInst *)CONCAT44(in_ESI,in_stack_fffffffffffffff0),in_RDX,
           CONCAT17(bVar4,in_stack_ffffffffffffffe0),(_Bool)positive);
  if (in_RDI->csh->detail != CS_OPT_OFF) {
    puVar3 = in_RDI->flat_insn->detail->groups +
             (ulong)(in_RDI->flat_insn->detail->field_6).x86.op_count * 0x30 + 0x55;
    puVar3[0] = '\x02';
    puVar3[1] = '\0';
    puVar3[2] = '\0';
    puVar3[3] = '\0';
    *(ulong *)(in_RDI->flat_insn->detail->groups +
              (ulong)(in_RDI->flat_insn->detail->field_6).x86.op_count * 0x30 + 0x5d) = (ulong)bVar4
    ;
    in_RDI->flat_insn->detail->groups
    [(ulong)(in_RDI->flat_insn->detail->field_6).x86.op_count * 0x30 + 0x75] = '\x01';
    MCInst_getOpcode(in_RDI);
    get_op_access(unaff_retaddr,(uint)((ulong)in_RDI >> 0x20),
                  (uint8_t *)CONCAT44(in_ESI,in_stack_fffffffffffffff0),(uint64_t *)in_RDX);
    in_RDI->flat_insn->detail->groups
    [(ulong)(in_RDI->flat_insn->detail->field_6).x86.op_count * 0x30 + 0x76] =
         (&stack0xffffffffffffffe1)[(in_RDI->flat_insn->detail->field_6).x86.op_count];
    pcVar1 = in_RDI->flat_insn->detail;
    (pcVar1->field_6).x86.op_count = (pcVar1->field_6).x86.op_count + '\x01';
  }
  return;
}

Assistant:

static void printU8Imm(MCInst *MI, unsigned Op, SStream *O)
{
	uint8_t val = MCOperand_getImm(MCInst_getOperand(MI, Op)) & 0xff;

	printImm(MI, O, val, true);

	if (MI->csh->detail) {
#ifndef CAPSTONE_DIET
		uint8_t access[6];
#endif

		MI->flat_insn->detail->x86.operands[MI->flat_insn->detail->x86.op_count].type = X86_OP_IMM;
		MI->flat_insn->detail->x86.operands[MI->flat_insn->detail->x86.op_count].imm = val;
		MI->flat_insn->detail->x86.operands[MI->flat_insn->detail->x86.op_count].size = 1;

#ifndef CAPSTONE_DIET
		get_op_access(MI->csh, MCInst_getOpcode(MI), access, &MI->flat_insn->detail->x86.eflags);
		MI->flat_insn->detail->x86.operands[MI->flat_insn->detail->x86.op_count].access = access[MI->flat_insn->detail->x86.op_count];
#endif

		MI->flat_insn->detail->x86.op_count++;
	}
}